

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void xPredIntraAngAdi_XY_16(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_10c;
  int i;
  pel *pfirst [2];
  int aligned_line_size;
  int left_size;
  int line_size;
  pel first_line [192];
  int iHeight_local;
  int iWidth_local;
  int uiDirMode_local;
  int i_dst_local;
  pel *dst_local;
  pel *pSrc_local;
  
  iVar2 = iWidth + iHeight / 2;
  iVar3 = iVar2 + -1;
  iVar4 = iVar3 - iWidth;
  lVar1 = (long)((iVar2 + 0xe >> 4) << 4) + -0xe8;
  dst_local = pSrc + -(long)(iHeight + -2);
  for (local_10c = 0; local_10c < iVar4; local_10c = local_10c + 1) {
    *(char *)((long)&left_size + (long)local_10c) =
         (char)((int)((uint)*dst_local + (uint)dst_local[1] * 2 + (uint)dst_local[2] + 2) >> 2);
    *(char *)((long)&left_size + local_10c + lVar1 + 0xe8) =
         (char)((int)((uint)dst_local[-1] + (uint)*dst_local * 2 + (uint)dst_local[1] + 2) >> 2);
    dst_local = dst_local + 2;
  }
  for (; local_10c < iVar3; local_10c = local_10c + 1) {
    *(char *)((long)&left_size + (long)local_10c) =
         (char)((int)((uint)dst_local[-1] + ((uint)*dst_local + (uint)dst_local[1]) * 3 +
                      (uint)dst_local[2] + 4) >> 3);
    *(char *)((long)&left_size + local_10c + lVar1 + 0xe8) =
         (char)((int)((uint)dst_local[-1] + (uint)*dst_local * 2 + (uint)dst_local[1] + 2) >> 2);
    dst_local = dst_local + 1;
  }
  first_line._184_4_ = iHeight / 2;
  first_line._188_4_ = iWidth;
  _uiDirMode_local = dst;
  for (local_10c = 0; local_10c < (int)first_line._184_4_; local_10c = local_10c + 1) {
    memcpy(_uiDirMode_local,(void *)((long)&left_size + ((long)iVar4 - (long)local_10c)),
           (long)(int)first_line._188_4_);
    memcpy(_uiDirMode_local + i_dst,
           (void *)((long)&left_size + ((iVar4 + lVar1) - (long)local_10c) + 0xe8),
           (long)(int)first_line._188_4_);
    _uiDirMode_local = _uiDirMode_local + (i_dst << 1);
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_16(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    ALIGNED_16(pel first_line[2 * (64 + 32)]);
    int line_size = iWidth + iHeight / 2 - 1;
    int left_size = line_size - iWidth;
    int aligned_line_size = ((line_size + 15) >> 4) << 4;
    pel *pfirst[2] = { first_line, first_line + aligned_line_size };

    int i;

    pSrc -= iHeight - 2;

    for (i = 0; i < left_size; i++, pSrc += 2) {
        pfirst[0][i] = (pSrc[0] + pSrc[1] * 2 + pSrc[2] + 2) >> 2;
        pfirst[1][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
    }

    for (; i < line_size; i++, pSrc++) {
        pfirst[0][i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
        pfirst[1][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
    }

    pfirst[0] += left_size;
    pfirst[1] += left_size;

    iHeight /= 2;

    for (i = 0; i < iHeight; i++) {
        memcpy(dst, pfirst[0] - i, iWidth * sizeof(pel));
        memcpy(dst + i_dst, pfirst[1] - i, iWidth * sizeof(pel));
        dst += 2 * i_dst;
    }
}